

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

void __thiscall procxx::pipe_t::pipe_t(pipe_t *this)

{
  uint uVar1;
  reference pvVar2;
  int flags;
  int pipe_result;
  lock_guard<std::mutex> lock;
  pipe_t *this_local;
  
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&flags,&pipe_t::mutex);
  pvVar2 = std::array<int,_2UL>::operator[](&this->pipe_,0);
  pipe(pvVar2);
  pvVar2 = std::array<int,_2UL>::operator[](&this->pipe_,0);
  uVar1 = fcntl(*pvVar2,1,0);
  pvVar2 = std::array<int,_2UL>::operator[](&this->pipe_,0);
  fcntl(*pvVar2,2,(ulong)(uVar1 | 1));
  pvVar2 = std::array<int,_2UL>::operator[](&this->pipe_,1);
  uVar1 = fcntl(*pvVar2,1,0);
  pvVar2 = std::array<int,_2UL>::operator[](&this->pipe_,1);
  fcntl(*pvVar2,2,(ulong)(uVar1 | 1));
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&flags);
  return;
}

Assistant:

pipe_t() {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock{mutex};
    int pipe_result = ::pipe(&pipe_[0]);
    (void)pipe_result;

    auto flags = ::fcntl(pipe_[0], F_GETFD, 0);
    ::fcntl(pipe_[0], F_SETFD, flags | FD_CLOEXEC);

    flags = ::fcntl(pipe_[1], F_GETFD, 0);
    ::fcntl(pipe_[1], F_SETFD, flags | FD_CLOEXEC);
  }